

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O2

bool __thiscall Am_Value_List::Member(Am_Value_List *this,Am_Wrapper *value)

{
  Am_List_Item *pAVar1;
  bool bVar2;
  Am_List_Item *this_00;
  
  pAVar1 = this->item;
  this_00 = pAVar1;
  while (this_00 != (Am_List_Item *)0x0) {
    bVar2 = Am_Value::operator==(&this_00->super_Am_Value,value);
    if (bVar2) goto LAB_0022f169;
    this_00 = this->item->next;
    this->item = this_00;
  }
  this->item = pAVar1;
LAB_0022f169:
  if (value != (Am_Wrapper *)0x0) {
    Am_Wrapper::Release(value);
  }
  return this_00 != (Am_List_Item *)0x0;
}

Assistant:

bool
Am_Value_List::Member(Am_Wrapper *value)
{
  Am_List_Item *old_item = item;
  while (item) {
    if (*item == value) {
      if (value)
        value->Release();
      return true;
    }
    item = item->next;
  }
  item = old_item;
  if (value)
    value->Release();
  return false;
}